

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::SlopesEqual(IntPoint pt1,IntPoint pt2,IntPoint pt3,bool UseFullInt64Range)

{
  long lVar1;
  Int128 local_a8;
  Int128 local_98;
  Int128 local_88;
  Int128 local_78;
  Int128 local_68;
  Int128 local_58;
  undefined1 local_41;
  long lStack_40;
  bool UseFullInt64Range_local;
  IntPoint pt3_local;
  IntPoint pt2_local;
  IntPoint pt1_local;
  
  pt3_local.X = pt3.Y;
  lStack_40 = pt3.X;
  lVar1 = pt2.Y;
  pt3_local.Y = pt2.X;
  local_41 = UseFullInt64Range;
  if (UseFullInt64Range) {
    Int128::Int128(&local_68,pt1.Y - lVar1);
    Int128::Int128(&local_78,pt3_local.Y - lStack_40);
    Int128::operator*(&local_58,&local_68);
    Int128::Int128(&local_98,pt1.X - pt3_local.Y);
    Int128::Int128(&local_a8,lVar1 - pt3_local.X);
    Int128::operator*(&local_88,&local_98);
    pt1_local.Y._7_1_ = Int128::operator==(&local_58,&local_88);
  }
  else {
    pt1_local.Y._7_1_ =
         (pt1.Y - lVar1) * (pt3_local.Y - lStack_40) - (pt1.X - pt3_local.Y) * (lVar1 - pt3_local.X)
         == 0;
  }
  return pt1_local.Y._7_1_;
}

Assistant:

bool SlopesEqual(const IntPoint pt1, const IntPoint pt2,
  const IntPoint pt3, bool UseFullInt64Range)
{
  if (UseFullInt64Range)
    return Int128(pt1.Y-pt2.Y) * Int128(pt2.X-pt3.X) ==
      Int128(pt1.X-pt2.X) * Int128(pt2.Y-pt3.Y);
  else return (pt1.Y-pt2.Y)*(pt2.X-pt3.X) == (pt1.X-pt2.X)*(pt2.Y-pt3.Y);
}